

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void cppurses::detail::Screen::basic_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  bool bVar1;
  reference point;
  Glyph local_50;
  reference local_38;
  value_type *point_tile;
  const_iterator __end2;
  const_iterator __begin2;
  Screen_descriptor *__range2;
  Screen_descriptor *staged_tiles_local;
  Widget *widg_local;
  
  cover_leftovers(widg,staged_tiles);
  __end2 = std::
           unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>
           ::begin(staged_tiles);
  point_tile = (value_type *)
               std::
               unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>
               ::end(staged_tiles);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                       ,(_Node_iterator_base<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false>
                         *)&point_tile);
    if (!bVar1) break;
    point = std::__detail::
            _Node_const_iterator<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false,_false>::
            operator*(&__end2);
    local_38 = point;
    Glyph::Glyph(&local_50,&point->second);
    basic_paint_single_point(widg,&point->first,&local_50);
    Glyph::~Glyph(&local_50);
    std::__detail::
    _Node_const_iterator<std::pair<const_cppurses::Point,_cppurses::Glyph>,_false,_false>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void Screen::basic_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    cover_leftovers(widg, staged_tiles);
    for (const auto& point_tile : staged_tiles) {
        basic_paint_single_point(widg, point_tile.first, point_tile.second);
    }
}